

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPDiscreteStatistics.cpp
# Opt level: O0

size_t __thiscall
MADPDiscreteStatistics::ComputeEstimatedSizeForCachingJointBeliefs(MADPDiscreteStatistics *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  long lVar3;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  size_t JBCacheSizeInMB;
  size_t JBCacheSizeInBits;
  size_t JBSize;
  size_t nrJBs;
  size_t doubleSizeInBits;
  size_t doubleSizeInChars;
  MADPDiscreteStatistics *in_stack_00000110;
  undefined1 auVar5 [64];
  
  sVar2 = ComputeNrJointActionObservationHistories(in_stack_00000110);
  lVar3 = (**(code **)(*(long *)*in_RDI + 0x30))();
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar5._0_16_,sVar2 * lVar3 * 0x40);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar1._0_8_ * 1.1920928955078125e-07;
  sVar2 = vcvttsd2usi_avx512f(auVar4);
  return sVar2;
}

Assistant:

size_t MADPDiscreteStatistics::ComputeEstimatedSizeForCachingJointBeliefs()
{

    size_t doubleSizeInChars = sizeof(double);
    size_t doubleSizeInBits = doubleSizeInChars * CHAR_BIT;

    //the number of joint beliefs that would have to be cached
    size_t nrJBs = ComputeNrJointActionObservationHistories();
    //the size of those joint beliefs:
    size_t JBSize = _m_madp->GetNrStates();

    size_t JBCacheSizeInBits = nrJBs* JBSize * doubleSizeInBits;
    size_t JBCacheSizeInMB = (double) JBCacheSizeInBits / (8 * 1024 * 1024);
    return JBCacheSizeInMB;

}